

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

void __thiscall
brotli::HashToBinaryTree::Init
          (HashToBinaryTree *this,int lgwin,size_t position,size_t bytes,bool is_last)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this->need_init_ == true) {
    uVar4 = -1 << ((byte)lgwin & 0x1f);
    uVar1 = uVar4 + 1;
    uVar5 = (ulong)~uVar4;
    this->window_mask_ = uVar5;
    this->invalid_pos_ = uVar1;
    lVar3 = 0;
    do {
      puVar2 = this->buckets_ + lVar3;
      *puVar2 = uVar1;
      puVar2[1] = uVar1;
      puVar2[2] = uVar1;
      puVar2[3] = uVar1;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20000);
    uVar5 = uVar5 + 1;
    if (!is_last) {
      bytes = uVar5;
    }
    if (position != 0) {
      bytes = uVar5;
    }
    puVar2 = (uint32_t *)operator_new__(-(ulong)((bytes & 0x6000000000000000) != 0) | bytes << 3);
    this->forest_ = puVar2;
    this->need_init_ = false;
  }
  return;
}

Assistant:

void Init(int lgwin, size_t position, size_t bytes, bool is_last) {
    if (need_init_) {
      window_mask_ = (1u << lgwin) - 1u;
      invalid_pos_ = static_cast<uint32_t>(-window_mask_);
      for (uint32_t i = 0; i < kBucketSize; i++) {
        buckets_[i] = invalid_pos_;
      }
      size_t num_nodes = (position == 0 && is_last) ? bytes : window_mask_ + 1;
      forest_ = new uint32_t[2 * num_nodes];
      need_init_ = false;
    }
  }